

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::raster::Triangle::computeUnitInwardNormals(Triangle *this)

{
  float fVar1;
  float fVar2;
  Vector2 VVar3;
  Vector2 local_50;
  Vector2 local_48;
  Vector2 local_40;
  Vector2 local_38;
  Vector2 local_30;
  Vector2 local_28;
  Vector2 local_20;
  Vector2 local_18;
  Triangle *local_10;
  Triangle *this_local;
  
  local_10 = this;
  local_18 = operator-(&this->v1,&this->v2);
  this->n1 = local_18;
  Vector2::Vector2(&local_20,-(this->n1).y,(this->n1).x);
  this->n1 = local_20;
  fVar2 = (this->n1).x;
  fVar1 = (this->n1).y;
  fVar2 = sqrtf(fVar2 * fVar2 + fVar1 * fVar1);
  local_28 = operator*(&this->n1,1.0 / fVar2);
  this->n1 = local_28;
  local_30 = operator-(&this->v2,&this->v3);
  this->n2 = local_30;
  Vector2::Vector2(&local_38,-(this->n2).y,(this->n2).x);
  this->n2 = local_38;
  fVar2 = (this->n2).x;
  fVar1 = (this->n2).y;
  fVar2 = sqrtf(fVar2 * fVar2 + fVar1 * fVar1);
  local_40 = operator*(&this->n2,1.0 / fVar2);
  this->n2 = local_40;
  local_48 = operator-(&this->v3,&this->v1);
  this->n3 = local_48;
  Vector2::Vector2(&local_50,-(this->n3).y,(this->n3).x);
  this->n3 = local_50;
  fVar2 = (this->n3).x;
  fVar1 = (this->n3).y;
  fVar2 = sqrtf(fVar2 * fVar2 + fVar1 * fVar1);
  VVar3 = operator*(&this->n3,1.0 / fVar2);
  this->n3 = VVar3;
  return;
}

Assistant:

void computeUnitInwardNormals()
	{
		n1 = v1 - v2;
		n1 = Vector2(-n1.y, n1.x);
		n1 = n1 * (1.0f / sqrtf(n1.x * n1.x + n1.y * n1.y));
		n2 = v2 - v3;
		n2 = Vector2(-n2.y, n2.x);
		n2 = n2 * (1.0f / sqrtf(n2.x * n2.x + n2.y * n2.y));
		n3 = v3 - v1;
		n3 = Vector2(-n3.y, n3.x);
		n3 = n3 * (1.0f / sqrtf(n3.x * n3.x + n3.y * n3.y));
	}